

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O2

void learn_randomized(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  uint local_50;
  float local_4c;
  
  uVar3 = (ec->l).multi.label;
  fVar1 = (ec->l).simple.weight;
  if (((ulong)uVar3 == 0) || ((uVar3 != 0xffffffff && (o->k < (ulong)uVar3)))) {
    poVar5 = std::operator<<((ostream *)&std::cout,"label ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," is not in {1,");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"} This won\'t work right.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  (ec->l).multi.label = 0x3f800000;
  *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
  LEARNER::learner<char,_example>::learn(base,ec,(ulong)(uVar3 - 1));
  fVar2 = ec->weight;
  local_4c = ec->partial_prediction;
  (ec->l).multi.label = 0xbf800000;
  ec->weight = ((float)o->k / (float)o->num_subsample) * fVar2;
  uVar6 = o->subsample_id;
  uVar7 = 0;
  local_50 = uVar3;
  do {
    do {
      if (o->num_subsample <= uVar7) {
        o->subsample_id = uVar6;
        (ec->pred).multiclass = local_50;
        (ec->l).multi.label = uVar3;
        (ec->l).simple.weight = fVar1;
        ec->weight = fVar2;
        return;
      }
      uVar4 = o->subsample_order[uVar6];
      uVar6 = (uVar6 + 1) % o->k;
    } while (uVar4 == uVar3 - 1);
    LEARNER::learner<char,_example>::learn(base,ec,(ulong)uVar4);
    fVar8 = ec->partial_prediction;
    uVar4 = uVar4 + 1;
    if (fVar8 <= local_4c) {
      fVar8 = local_4c;
      uVar4 = local_50;
    }
    local_50 = uVar4;
    uVar7 = uVar7 + 1;
    local_4c = fVar8;
  } while( true );
}

Assistant:

void learn_randomized(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t ld = ec.l.multi;
  if (ld.label == 0 || (ld.label > o.k && ld.label != (uint32_t)-1))
    cout << "label " << ld.label << " is not in {1," << o.k << "} This won't work right." << endl;

  ec.l.simple = {1., 0.f, 0.f};  // truth
  base.learn(ec, ld.label - 1);

  size_t prediction = ld.label;
  float best_partial_prediction = ec.partial_prediction;

  ec.l.simple.label = -1.;
  float weight_temp = ec.weight;
  ec.weight *= ((float)o.k) / (float)o.num_subsample;
  size_t p = o.subsample_id;
  size_t count = 0;
  while (count < o.num_subsample)
  {
    uint32_t l = o.subsample_order[p];
    p = (p + 1) % o.k;
    if (l == ld.label - 1)
      continue;
    base.learn(ec, l);
    if (ec.partial_prediction > best_partial_prediction)
    {
      best_partial_prediction = ec.partial_prediction;
      prediction = l + 1;
    }
    count++;
  }
  o.subsample_id = p;

  ec.pred.multiclass = (uint32_t)prediction;
  ec.l.multi = ld;
  ec.weight = weight_temp;
}